

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O0

Int64Vector * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_int64classlabels
          (KNearestNeighborsClassifier *this)

{
  bool bVar1;
  Int64Vector *this_00;
  KNearestNeighborsClassifier *this_local;
  
  bVar1 = has_int64classlabels(this);
  if (!bVar1) {
    clear_ClassLabels(this);
    set_has_int64classlabels(this);
    this_00 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_00);
    (this->ClassLabels_).int64classlabels_ = this_00;
  }
  return (Int64Vector *)(this->ClassLabels_).stringclasslabels_;
}

Assistant:

inline ::CoreML::Specification::Int64Vector* KNearestNeighborsClassifier::mutable_int64classlabels() {
  if (!has_int64classlabels()) {
    clear_ClassLabels();
    set_has_int64classlabels();
    ClassLabels_.int64classlabels_ = new ::CoreML::Specification::Int64Vector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.int64ClassLabels)
  return ClassLabels_.int64classlabels_;
}